

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall
TextButton::TextButton
          (TextButton *this,string *buttonText,Color *textColor,uint charSize,float x,float y,
          Color *color1,Color *color2,function<void_(int)> *action,int actionOption)

{
  Text *this_00;
  RectangleShape *this_01;
  Font *font;
  FloatRect FVar1;
  locale local_70 [8];
  Color *local_68;
  Color *local_60;
  Color *local_58;
  undefined1 local_50 [32];
  
  local_58 = textColor;
  UIComponent::UIComponent(&this->super_UIComponent);
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextButton_001c5150;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__TextButton_001c5188;
  this_00 = &this->text;
  sf::Text::Text(this_00);
  this_01 = &this->button;
  local_50._0_4_ = 0.0;
  local_50._4_4_ = 0.0;
  local_60 = color2;
  sf::RectangleShape::RectangleShape(this_01,(Vector2f *)local_50);
  local_68 = &this->color1;
  sf::Color::Color(local_68);
  sf::Color::Color(&this->color2);
  (this->action).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->action)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->action).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->action).super__Function_base._M_functor + 8) = 0;
  font = Board::getFont();
  sf::Text::setFont(this_00,font);
  std::locale::locale(local_70);
  sf::String::String((String *)local_50,buttonText,local_70);
  sf::Text::setString(this_00,(String *)local_50);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_50);
  std::locale::~locale(local_70);
  sf::Text::setFillColor(this_00,local_58);
  sf::Text::setCharacterSize(this_00,charSize);
  sf::Transformable::setPosition(&(this->text).super_Transformable,5.0,0.0);
  FVar1 = sf::Text::getLocalBounds(this_00);
  local_50._4_4_ = (float)charSize * 1.5;
  local_50._0_4_ = FVar1.width + 10.0;
  sf::RectangleShape::setSize(this_01,(Vector2f *)local_50);
  sf::Shape::setFillColor(&this_01->super_Shape,color1);
  sf::Transformable::setPosition(&(this->button).super_Shape.super_Transformable,0.0,0.0);
  sf::Transformable::setPosition(&(this->super_UIComponent).super_Transformable,x,y);
  *local_68 = *color1;
  this->color2 = *local_60;
  std::function<void_(int)>::operator=(&this->action,action);
  this->actionOption = actionOption;
  this->selected = false;
  return;
}

Assistant:

TextButton::TextButton(const string& buttonText, const Color& textColor, unsigned int charSize, float x, float y, const Color& color1, const Color& color2, function<void(int)> action, int actionOption) {
    text.setFont(Board::getFont());
    text.setString(buttonText);
    text.setFillColor(textColor);
    text.setCharacterSize(charSize);
    text.setPosition(5.0f, 0.0f);
    
    button.setSize(Vector2f(text.getLocalBounds().width + 10.0f, charSize * 1.5f));
    button.setFillColor(color1);
    button.setPosition(0.0f, 0.0f);
    
    setPosition(x, y);
    this->color1 = color1;
    this->color2 = color2;
    this->action = action;
    this->actionOption = actionOption;
    selected = false;
}